

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallGenerator::AddInstallRule
          (cmInstallGenerator *this,ostream *os,string *dest,cmInstallType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,bool optional,char *permissions_file,char *permissions_dir,char *rename,
          char *literal_args,Indent indent)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pbVar6;
  string *f;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string absDest;
  string local_b8;
  reference local_98;
  string *file;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool firstIteration;
  string local_60 [8];
  string stype;
  bool optional_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  cmInstallType type_local;
  string *dest_local;
  ostream *os_local;
  cmInstallGenerator *this_local;
  Indent indent_local;
  
  stype.field_2._M_local_buf[0xf] = optional;
  std::__cxx11::string::string(local_60);
  switch(type) {
  case cmInstallType_EXECUTABLE:
    std::__cxx11::string::operator=(local_60,"EXECUTABLE");
    break;
  case cmInstallType_STATIC_LIBRARY:
    std::__cxx11::string::operator=(local_60,"STATIC_LIBRARY");
    break;
  case cmInstallType_SHARED_LIBRARY:
    std::__cxx11::string::operator=(local_60,"SHARED_LIBRARY");
    break;
  case cmInstallType_MODULE_LIBRARY:
    std::__cxx11::string::operator=(local_60,"MODULE");
    break;
  case cmInstallType_FILES:
    std::__cxx11::string::operator=(local_60,"FILE");
    break;
  case cmInstallType_PROGRAMS:
    std::__cxx11::string::operator=(local_60,"PROGRAM");
    break;
  case cmInstallType_DIRECTORY:
    std::__cxx11::string::operator=(local_60,"DIRECTORY");
  }
  ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  bVar1 = cmsys::SystemTools::FileIsFullPath(dest);
  if (bVar1) {
    std::operator<<(os,"list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n");
    poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar3," \"");
    bVar1 = true;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(files);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(files);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar2) {
      local_98 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      if (!bVar1) {
        std::operator<<(os,";");
      }
      poVar3 = std::operator<<(os,(string *)dest);
      std::operator<<(poVar3,"/");
      if ((rename == (char *)0x0) || (*rename == '\0')) {
        cmsys::SystemTools::GetFilenameName(&local_b8,local_98);
        std::operator<<(os,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      else {
        std::operator<<(os,rename);
      }
      bVar1 = false;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::operator<<(os,"\")\n");
    poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar3,"if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n");
    poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar3 = ::operator<<(poVar3,(cmScriptGeneratorIndent)indent.Level);
    poVar3 = std::operator<<(poVar3,"message(WARNING \"ABSOLUTE path INSTALL ");
    std::operator<<(poVar3,"DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n");
    poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar3,"endif()\n");
    poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar3,"if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n");
    poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    absDest.field_2._12_4_ = indent.Level;
    poVar3 = ::operator<<(poVar3,(cmScriptGeneratorIndent)indent.Level);
    poVar3 = std::operator<<(poVar3,"message(FATAL_ERROR \"ABSOLUTE path INSTALL ");
    poVar3 = std::operator<<(poVar3,"DESTINATION forbidden (by caller): ");
    std::operator<<(poVar3,"${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n");
    absDest.field_2._8_4_ = indent.Level;
    poVar3 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar3,"endif()\n");
  }
  ConvertToAbsoluteDestination((string *)&__range2_1,this,dest);
  poVar3 = std::operator<<(os,"file(INSTALL DESTINATION \"");
  poVar3 = std::operator<<(poVar3,(string *)&__range2_1);
  poVar3 = std::operator<<(poVar3,"\" TYPE ");
  std::operator<<(poVar3,local_60);
  if ((stype.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::operator<<(os," OPTIONAL");
  }
  switch(this->Message) {
  case MessageDefault:
    break;
  case MessageAlways:
    std::operator<<(os," MESSAGE_ALWAYS");
    break;
  case MessageLazy:
    std::operator<<(os," MESSAGE_LAZY");
    break;
  case MessageNever:
    std::operator<<(os," MESSAGE_NEVER");
  }
  if ((permissions_file != (char *)0x0) && (*permissions_file != '\0')) {
    poVar3 = std::operator<<(os," PERMISSIONS");
    std::operator<<(poVar3,permissions_file);
  }
  if ((permissions_dir != (char *)0x0) && (*permissions_dir != '\0')) {
    poVar3 = std::operator<<(os," DIR_PERMISSIONS");
    std::operator<<(poVar3,permissions_dir);
  }
  if ((rename != (char *)0x0) && (*rename != '\0')) {
    poVar3 = std::operator<<(os," RENAME \"");
    poVar3 = std::operator<<(poVar3,rename);
    std::operator<<(poVar3,"\"");
  }
  std::operator<<(os," FILES");
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(files);
  if (sVar4 == 1) {
    poVar3 = std::operator<<(os," \"");
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](files,0);
    poVar3 = std::operator<<(poVar3,(string *)pvVar5);
    std::operator<<(poVar3,"\"");
  }
  else {
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(files);
    f = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(files);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&f), bVar1) {
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2_1);
      poVar3 = std::operator<<(os,"\n");
      poVar3 = ::operator<<(poVar3,(cmScriptGeneratorIndent)indent.Level);
      poVar3 = std::operator<<(poVar3,"  \"");
      poVar3 = std::operator<<(poVar3,(string *)pbVar6);
      std::operator<<(poVar3,"\"");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    poVar3 = std::operator<<(os,"\n");
    poVar3 = ::operator<<(poVar3,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar3," ");
    if ((literal_args == (char *)0x0) || (*literal_args == '\0')) {
      std::operator<<(os," ");
    }
  }
  if ((literal_args != (char *)0x0) && (*literal_args != '\0')) {
    std::operator<<(os,literal_args);
  }
  std::operator<<(os,")\n");
  std::__cxx11::string::~string((string *)&__range2_1);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void cmInstallGenerator::AddInstallRule(
  std::ostream& os, std::string const& dest, cmInstallType type,
  std::vector<std::string> const& files, bool optional /* = false */,
  const char* permissions_file /* = 0 */,
  const char* permissions_dir /* = 0 */, const char* rename /* = 0 */,
  const char* literal_args /* = 0 */, Indent indent)
{
  // Use the FILE command to install the file.
  std::string stype;
  switch (type) {
    case cmInstallType_DIRECTORY:
      stype = "DIRECTORY";
      break;
    case cmInstallType_PROGRAMS:
      stype = "PROGRAM";
      break;
    case cmInstallType_EXECUTABLE:
      stype = "EXECUTABLE";
      break;
    case cmInstallType_STATIC_LIBRARY:
      stype = "STATIC_LIBRARY";
      break;
    case cmInstallType_SHARED_LIBRARY:
      stype = "SHARED_LIBRARY";
      break;
    case cmInstallType_MODULE_LIBRARY:
      stype = "MODULE";
      break;
    case cmInstallType_FILES:
      stype = "FILE";
      break;
  }
  os << indent;
  if (cmSystemTools::FileIsFullPath(dest)) {
    os << "list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n";
    os << indent << " \"";
    bool firstIteration = true;
    for (std::string const& file : files) {
      if (!firstIteration) {
        os << ";";
      }
      os << dest << "/";
      if (rename && *rename) {
        os << rename;
      } else {
        os << cmSystemTools::GetFilenameName(file);
      }
      firstIteration = false;
    }
    os << "\")\n";
    os << indent << "if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
    os << indent << indent << "message(WARNING \"ABSOLUTE path INSTALL "
       << "DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
    os << indent << "endif()\n";

    os << indent << "if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
    os << indent << indent << "message(FATAL_ERROR \"ABSOLUTE path INSTALL "
       << "DESTINATION forbidden (by caller): "
       << "${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
    os << indent << "endif()\n";
  }
  std::string absDest = this->ConvertToAbsoluteDestination(dest);
  os << "file(INSTALL DESTINATION \"" << absDest << "\" TYPE " << stype;
  if (optional) {
    os << " OPTIONAL";
  }
  switch (this->Message) {
    case MessageDefault:
      break;
    case MessageAlways:
      os << " MESSAGE_ALWAYS";
      break;
    case MessageLazy:
      os << " MESSAGE_LAZY";
      break;
    case MessageNever:
      os << " MESSAGE_NEVER";
      break;
  }
  if (permissions_file && *permissions_file) {
    os << " PERMISSIONS" << permissions_file;
  }
  if (permissions_dir && *permissions_dir) {
    os << " DIR_PERMISSIONS" << permissions_dir;
  }
  if (rename && *rename) {
    os << " RENAME \"" << rename << "\"";
  }
  os << " FILES";
  if (files.size() == 1) {
    os << " \"" << files[0] << "\"";
  } else {
    for (std::string const& f : files) {
      os << "\n" << indent << "  \"" << f << "\"";
    }
    os << "\n" << indent << " ";
    if (!(literal_args && *literal_args)) {
      os << " ";
    }
  }
  if (literal_args && *literal_args) {
    os << literal_args;
  }
  os << ")\n";
}